

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O0

void icu_63::initChineseCalZoneAstroCalc(void)

{
  SimpleTimeZone *this;
  size_t in_RSI;
  SimpleTimeZone *local_70;
  ConstChar16Ptr local_58;
  UnicodeString local_50;
  undefined1 local_9;
  
  this = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,in_RSI);
  local_70 = (SimpleTimeZone *)0x0;
  if (this != (SimpleTimeZone *)0x0) {
    local_9 = 1;
    ConstChar16Ptr::ConstChar16Ptr(&local_58,L"CHINA_ZONE");
    UnicodeString::UnicodeString(&local_50,'\x01',&local_58,-1);
    SimpleTimeZone::SimpleTimeZone(this,28800000,&local_50);
    local_70 = this;
  }
  local_9 = 0;
  gChineseCalendarZoneAstroCalc = (TimeZone *)local_70;
  if (this != (SimpleTimeZone *)0x0) {
    UnicodeString::~UnicodeString(&local_50);
    ConstChar16Ptr::~ConstChar16Ptr(&local_58);
  }
  ucln_i18n_registerCleanup_63(UCLN_I18N_CHINESE_CALENDAR,calendar_chinese_cleanup);
  return;
}

Assistant:

static void U_CALLCONV initChineseCalZoneAstroCalc() {
    gChineseCalendarZoneAstroCalc = new SimpleTimeZone(CHINA_OFFSET, UNICODE_STRING_SIMPLE("CHINA_ZONE") );
    ucln_i18n_registerCleanup(UCLN_I18N_CHINESE_CALENDAR, calendar_chinese_cleanup);
}